

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AttachmentInteractionCase::iterate
          (AttachmentInteractionCase *this)

{
  RenderContext *pRVar1;
  GLuint GVar2;
  TestLog *pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  bool local_259;
  Vector<int,_2> local_1c4;
  Vector<int,_2> local_1bc [2];
  MessageBuilder local_1a8;
  undefined4 local_28;
  GLuint local_24;
  GLuint renderbuffer;
  GLuint framebuffer;
  TestLog *log;
  Functions *gl;
  AttachmentInteractionCase *this_local;
  
  gl = (Functions *)this;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  log = (TestLog *)CONCAT44(extraout_var,iVar5);
  _renderbuffer = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  local_24 = 0;
  local_28 = 0;
  (*(code *)log[0xda].m_log)(1,&local_24);
  (*(code *)log[0xf].m_log)(0x8ca9,local_24);
  (*(code *)log[0xcf].m_log)(0x8ca9,0x9310,(this->m_defaultSpec).width);
  (*(code *)log[0xcf].m_log)(0x8ca9,0x9311,(this->m_defaultSpec).height);
  (*(code *)log[0xcf].m_log)(0x8ca9,0x9313,(this->m_defaultSpec).samples);
  (*(code *)log[0xdd].m_log)(1,&local_28);
  (*(code *)log[0x14].m_log)(0x8d41,local_28);
  (*(code *)log[0x248].m_log)
            (0x8d41,(this->m_attachmentSpec).samples,0x8058,(this->m_attachmentSpec).width,
             (this->m_attachmentSpec).height);
  (*(code *)log[0xd1].m_log)(0x8d40,0x8ce0,0x8d41,local_28);
  tcu::TestLog::operator<<(&local_1a8,_renderbuffer,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [11])"Verifying ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&(this->m_attachmentSpec).width);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xfb29fd);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&(this->m_attachmentSpec).height);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])0xf6c396);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&(this->m_attachmentSpec).samples);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])"x multisampling");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])" and defaults set to ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&(this->m_defaultSpec).width);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xfb29fd);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&(this->m_defaultSpec).height);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0xf096f1);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&(this->m_defaultSpec).samples);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])"x multisampling");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  pTVar3 = _renderbuffer;
  GVar2 = local_24;
  pRVar1 = this->m_renderCtx;
  tcu::Vector<int,_2>::Vector
            (local_1bc,(this->m_attachmentSpec).width,(this->m_attachmentSpec).height);
  bVar4 = checkFramebufferRenderable(pTVar3,pRVar1,GVar2,local_1bc);
  pTVar3 = _renderbuffer;
  GVar2 = local_24;
  local_259 = false;
  if (bVar4) {
    pRVar1 = this->m_renderCtx;
    tcu::Vector<int,_2>::Vector
              (&local_1c4,(this->m_attachmentSpec).width,(this->m_attachmentSpec).height);
    local_259 = checkFramebufferSize(pTVar3,pRVar1,GVar2,&local_1c4);
  }
  if (local_259 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Framebuffer did not behave as expected");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  (*(code *)log[0x8c].m_log)(1,&local_28);
  (*(code *)log[0x88].m_log)(1,&local_24);
  return STOP;
}

Assistant:

AttachmentInteractionCase::IterateResult AttachmentInteractionCase::iterate (void)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	TestLog&				log			= m_testCtx.getLog();
	GLuint					framebuffer	= 0;
	GLuint					renderbuffer= 0;

	gl.genFramebuffers(1, &framebuffer);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_WIDTH, m_defaultSpec.width);
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_HEIGHT, m_defaultSpec.height);
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_SAMPLES, m_defaultSpec.samples);

	gl.genRenderbuffers(1, &renderbuffer);
	gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_attachmentSpec.samples, GL_RGBA8, m_attachmentSpec.width, m_attachmentSpec.height);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbuffer);

	log << TestLog::Message << "Verifying " << m_attachmentSpec.width << "x" << m_attachmentSpec.height << " framebuffer with " << m_attachmentSpec.samples << "x multisampling"
		<< " and defaults set to " << m_defaultSpec.width << "x" << m_defaultSpec.height << " with " << m_defaultSpec.samples << "x multisampling" << TestLog::EndMessage;

	if(checkFramebufferRenderable(log, m_renderCtx, framebuffer, IVec2(m_attachmentSpec.width, m_attachmentSpec.height))
	   && checkFramebufferSize(log, m_renderCtx, framebuffer, IVec2(m_attachmentSpec.width, m_attachmentSpec.height)))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Framebuffer did not behave as expected");

	gl.deleteRenderbuffers(1, &renderbuffer);
	gl.deleteFramebuffers(1, &framebuffer);

	return STOP;
}